

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cbaNtk.c
# Opt level: O1

void Cba_NtkPrintStatsFull(Cba_Ntk_t *p,int fDistrib,int fVerbose)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar10;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  Cba_Man_t *pCVar22;
  char *pcVar23;
  int fVerbose_00;
  long lVar24;
  undefined1 auVar25 [16];
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  undefined1 auVar34 [16];
  undefined1 auVar35 [16];
  undefined1 auVar36 [16];
  undefined1 auVar37 [16];
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  undefined1 auVar40 [16];
  undefined1 auVar41 [16];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  undefined1 auVar48 [16];
  char *pTypeNames [90];
  char *pcStack_2f8;
  undefined8 local_2f0 [89];
  
  Cba_ManCreatePrimMap(&pcStack_2f8);
  pcVar23 = Abc_NamStr(p->pDesign->pStrs,p->NameId);
  printf("%-20s : ",pcVar23);
  printf("PI = %4d  ",(ulong)(uint)(p->vInputs).nSize);
  printf("PO = %4d  ",(ulong)(uint)(p->vOutputs).nSize);
  printf("FF = %4d  ",(ulong)(uint)(p->vSeq).nSize);
  printf("Obj = %6d  ",(ulong)((p->vObjType).nSize - 1));
  iVar1 = (p->vInputs).nCap;
  auVar25._8_4_ = iVar1 >> 0x1f;
  auVar25._0_8_ = (long)iVar1;
  auVar25._12_4_ = 0x45300000;
  iVar2 = (p->vOutputs).nCap;
  auVar26._8_4_ = iVar2 >> 0x1f;
  auVar26._0_8_ = (long)iVar2;
  auVar26._12_4_ = 0x45300000;
  iVar3 = (p->vOrder).nCap;
  auVar27._8_4_ = iVar3 >> 0x1f;
  auVar27._0_8_ = (long)iVar3;
  auVar27._12_4_ = 0x45300000;
  iVar4 = (p->vSeq).nCap;
  auVar28._8_4_ = iVar4 >> 0x1f;
  auVar28._0_8_ = (long)iVar4;
  auVar28._12_4_ = 0x45300000;
  iVar5 = (p->vObjType).nCap;
  auVar29._8_4_ = iVar5 >> 0x1f;
  auVar29._0_8_ = (long)iVar5;
  auVar29._12_4_ = 0x45300000;
  iVar6 = (p->vObjFin0).nCap;
  auVar30._8_4_ = iVar6 >> 0x1f;
  auVar30._0_8_ = (long)iVar6;
  auVar30._12_4_ = 0x45300000;
  iVar7 = (p->vObjFon0).nCap;
  auVar31._8_4_ = iVar7 >> 0x1f;
  auVar31._0_8_ = (long)iVar7;
  auVar31._12_4_ = 0x45300000;
  iVar8 = (p->vFinFon).nCap;
  auVar32._8_4_ = iVar8 >> 0x1f;
  auVar32._0_8_ = (long)iVar8;
  auVar32._12_4_ = 0x45300000;
  iVar9 = (p->vFonObj).nCap;
  auVar33._8_4_ = iVar9 >> 0x1f;
  auVar33._0_8_ = (long)iVar9;
  auVar33._12_4_ = 0x45300000;
  iVar10 = (p->vObjCopy).nCap;
  auVar34._8_4_ = iVar10 >> 0x1f;
  auVar34._0_8_ = (long)iVar10;
  auVar34._12_4_ = 0x45300000;
  fVerbose_00 = (int)(((auVar34._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,iVar10) - 4503599627370496.0)) * 4.0 + 16.0) +
                (int)(((auVar33._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,iVar9) - 4503599627370496.0)) * 4.0 + 16.0) +
                (int)(((auVar32._8_8_ - 1.9342813113834067e+25) +
                      ((double)CONCAT44(0x43300000,iVar8) - 4503599627370496.0)) * 4.0 + 16.0);
  iVar8 = (p->vObjFunc).nCap;
  auVar35._8_4_ = iVar8 >> 0x1f;
  auVar35._0_8_ = (long)iVar8;
  auVar35._12_4_ = 0x45300000;
  iVar9 = (p->vObjName).nCap;
  auVar36._8_4_ = iVar9 >> 0x1f;
  auVar36._0_8_ = (long)iVar9;
  auVar36._12_4_ = 0x45300000;
  iVar10 = (p->vObjAttr).nCap;
  auVar37._8_4_ = iVar10 >> 0x1f;
  auVar37._0_8_ = (long)iVar10;
  auVar37._12_4_ = 0x45300000;
  iVar11 = (p->vAttrSto).nCap;
  auVar38._8_4_ = iVar11 >> 0x1f;
  auVar38._0_8_ = (long)iVar11;
  auVar38._12_4_ = 0x45300000;
  iVar12 = (p->vFonCopy).nCap;
  auVar39._8_4_ = iVar12 >> 0x1f;
  auVar39._0_8_ = (long)iVar12;
  auVar39._12_4_ = 0x45300000;
  iVar13 = (p->vFonName).nCap;
  auVar40._8_4_ = iVar13 >> 0x1f;
  auVar40._0_8_ = (long)iVar13;
  auVar40._12_4_ = 0x45300000;
  iVar14 = (p->vFonRange).nCap;
  auVar41._8_4_ = iVar14 >> 0x1f;
  auVar41._0_8_ = (long)iVar14;
  auVar41._12_4_ = 0x45300000;
  iVar15 = (p->vFonPrev).nCap;
  auVar42._8_4_ = iVar15 >> 0x1f;
  auVar42._0_8_ = (long)iVar15;
  auVar42._12_4_ = 0x45300000;
  iVar16 = (p->vFonNext).nCap;
  auVar43._8_4_ = iVar16 >> 0x1f;
  auVar43._0_8_ = (long)iVar16;
  auVar43._12_4_ = 0x45300000;
  iVar17 = (p->vFinFon0).nCap;
  auVar44._8_4_ = iVar17 >> 0x1f;
  auVar44._0_8_ = (long)iVar17;
  auVar44._12_4_ = 0x45300000;
  iVar18 = (p->vFinObj).nCap;
  auVar45._8_4_ = iVar18 >> 0x1f;
  auVar45._0_8_ = (long)iVar18;
  auVar45._12_4_ = 0x45300000;
  iVar19 = (p->vNtkObjs).nCap;
  auVar46._8_4_ = iVar19 >> 0x1f;
  auVar46._0_8_ = (long)iVar19;
  auVar46._12_4_ = 0x45300000;
  iVar20 = (p->vFonBits).nCap;
  auVar47._8_4_ = iVar20 >> 0x1f;
  auVar47._0_8_ = (long)iVar20;
  auVar47._12_4_ = 0x45300000;
  iVar21 = (p->vArray1).nCap;
  auVar48._8_4_ = iVar21 >> 0x1f;
  auVar48._0_8_ = (long)iVar21;
  auVar48._12_4_ = 0x45300000;
  printf("Mem = %.3f MB",
         (double)((int)(((auVar47._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,iVar20) - 4503599627370496.0)) * 4.0 + 16.0) +
                  (int)(((auVar46._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,iVar19) - 4503599627370496.0)) * 4.0 + 16.0) +
                  (int)(((auVar45._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,iVar18) - 4503599627370496.0)) * 4.0 + 16.0) +
                  (int)(((auVar44._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,iVar17) - 4503599627370496.0)) * 4.0 + 16.0) +
                  (int)(((auVar43._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,iVar16) - 4503599627370496.0)) * 4.0 + 16.0) +
                  (int)(((auVar42._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,iVar15) - 4503599627370496.0)) * 4.0 + 16.0) +
                  (int)(((auVar41._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,iVar14) - 4503599627370496.0)) * 4.0 + 16.0) +
                  (int)(((auVar40._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,iVar13) - 4503599627370496.0)) * 4.0 + 16.0) +
                  (int)(((auVar39._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,iVar12) - 4503599627370496.0)) * 4.0 + 16.0) +
                  (int)(((auVar38._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,iVar11) - 4503599627370496.0)) * 4.0 + 16.0) +
                  (int)(((auVar37._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,iVar10) - 4503599627370496.0)) * 4.0 + 16.0) +
                  (int)(((auVar36._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,iVar9) - 4503599627370496.0)) * 4.0 + 16.0) +
                  (int)(((auVar35._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,iVar8) - 4503599627370496.0)) * 4.0 + 16.0) +
                  fVerbose_00 +
                  (int)(((auVar31._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,iVar7) - 4503599627370496.0)) * 4.0 + 16.0) +
                  (int)(((auVar30._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,iVar6) - 4503599627370496.0)) * 4.0 + 16.0) +
                  (int)((auVar29._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,iVar5) - 4503599627370496.0) + 16.0) +
                  (int)(((auVar28._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,iVar4) - 4503599627370496.0)) * 4.0 + 16.0) +
                  (int)(((auVar27._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,iVar3) - 4503599627370496.0)) * 4.0 + 16.0) +
                  (int)(((auVar26._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,iVar2) - 4503599627370496.0)) * 4.0 + 16.0) +
                  (int)(((auVar25._8_8_ - 1.9342813113834067e+25) +
                        ((double)CONCAT44(0x43300000,iVar1) - 4503599627370496.0)) * 4.0 + 16.0) +
                  0x1b0 + (int)(((auVar48._8_8_ - 1.9342813113834067e+25) +
                                ((double)CONCAT44(0x43300000,iVar21) - 4503599627370496.0)) * 4.0 +
                               16.0) * 2) * 9.5367431640625e-07);
  putchar(10);
  if (fDistrib == 0) {
    if (fVerbose != 0) {
      puts("Node type statistics:");
      lVar24 = 0;
      do {
        pCVar22 = p->pDesign;
        if (pCVar22->nObjs[lVar24 + 1] != 0) {
          if ((pCVar22->nAnds[0] == 0) || (pCVar22->nAnds[lVar24 + 1] == 0)) {
            printf("%2d  :  %-8s  %6d\n",(ulong)((int)lVar24 + 1),local_2f0[lVar24]);
          }
          else {
            printf("%2d  :  %-8s  %6d  %7.2f %%\n",
                   ((double)pCVar22->nAnds[lVar24 + 1] * 100.0) / (double)pCVar22->nAnds[0],
                   (ulong)((int)lVar24 + 1),local_2f0[lVar24]);
          }
        }
        lVar24 = lVar24 + 1;
      } while (lVar24 != 0x59);
    }
  }
  else {
    Cba_NtkPrintDistrib(p,fVerbose_00);
  }
  return;
}

Assistant:

void Cba_NtkPrintStatsFull( Cba_Ntk_t * p, int fDistrib, int fVerbose )
{
    int i;
    char * pTypeNames[CBA_BOX_LAST];
    Cba_ManCreatePrimMap( pTypeNames );
    printf( "%-20s : ",        Cba_NtkName(p) );
    printf( "PI = %4d  ",      Cba_NtkPiNum(p) );
    printf( "PO = %4d  ",      Cba_NtkPoNum(p) );
    printf( "FF = %4d  ",      Cba_NtkBoxSeqNum(p) );
    printf( "Obj = %6d  ",     Cba_NtkObjNum(p) );
    printf( "Mem = %.3f MB",   1.0*Cba_NtkMemory(p)/(1<<20) );
    printf( "\n" );
    if ( fDistrib )
    {
        Cba_NtkPrintDistrib( p, fVerbose );
        return;
    }
    if ( !fVerbose )
        return;
    printf( "Node type statistics:\n" );
    for ( i = 1; i < CBA_BOX_LAST; i++ )
    {
        if ( !p->pDesign->nObjs[i] )
            continue;
        if ( p->pDesign->nAnds[0] && p->pDesign->nAnds[i] )
            printf( "%2d  :  %-8s  %6d  %7.2f %%\n", i, pTypeNames[i], p->pDesign->nObjs[i], 100.0*p->pDesign->nAnds[i]/p->pDesign->nAnds[0] );
        else
            printf( "%2d  :  %-8s  %6d\n", i, pTypeNames[i], p->pDesign->nObjs[i] );
    }
}